

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O2

bool __thiscall
stackless::microthreading::Microthread<implementations::scheme::SchemeImplementation>::executeCycle
          (Microthread<implementations::scheme::SchemeImplementation> *this)

{
  bool bVar1;
  
  bVar1 = this->sleeping;
  if (bVar1 == false) {
    Implementation<implementations::scheme::environment,_implementations::scheme::SchemeFrame>::
    execute(&((this->impl).
              super___shared_ptr<implementations::scheme::SchemeImplementation,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->
             super_Implementation<implementations::scheme::environment,_implementations::scheme::SchemeFrame>
           );
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool executeCycle() {
				if (sleeping) {
					//std::cerr << "executeCycle() abort due to sleeping" << std::endl;
					return false;
				}
				//return
				impl->execute();
				return true;
			}